

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O3

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::createProgram(COpenGLSLMaterialRenderer *this)

{
  long lVar1;
  GLuint GVar2;
  GLhandleARB GVar3;
  
  lVar1 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
  if (*(ushort *)(lVar1 + 0x4d0) < 200) {
    if (*(code **)(lVar1 + 0x740) == (code *)0x0) {
      GVar3 = 0;
    }
    else {
      GVar3 = (**(code **)(lVar1 + 0x740))();
    }
    this->Program = GVar3;
  }
  else {
    if (*(code **)(lVar1 + 0x768) == (code *)0x0) {
      GVar2 = 0;
    }
    else {
      GVar2 = (**(code **)(lVar1 + 0x768))();
    }
    this->Program2 = GVar2;
  }
  return true;
}

Assistant:

bool COpenGLSLMaterialRenderer::createProgram()
{
	if (Driver->Version >= 200)
		Program2 = Driver->extGlCreateProgram();
	else
		Program = Driver->extGlCreateProgramObject();
	return true;
}